

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall
chrono::ChMatterSPH::IntStateScatter
          (ChMatterSPH *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,
          bool full_update)

{
  pointer psVar1;
  uint uVar2;
  ulong uVar3;
  double *local_68;
  undefined8 local_60;
  ChState *local_50;
  ulong local_48;
  long local_38;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      local_48 = (ulong)off_x;
      local_68 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_48;
      local_38 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_60 = 3;
      local_50 = x;
      if (local_38 + -3 < (long)local_48) {
LAB_0053fe8f:
        local_60 = 3;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      ChVector<double>::operator=
                (&((psVar1[uVar3].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_ChNodeXYZ).pos,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_68);
      local_48 = (ulong)off_v;
      local_68 = (v->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_48;
      local_38 = (v->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_60 = 3;
      local_50 = (ChState *)v;
      if (local_38 + -3 < (long)local_48) goto LAB_0053fe8f;
      ChVector<double>::operator=
                (&(((this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar3].
                    super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_ChNodeXYZ).pos_dt,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_68);
      uVar3 = (ulong)uVar2;
      psVar1 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      off_v = off_v + 3;
      off_x = off_x + 3;
      uVar2 = uVar2 + 1;
    } while (uVar3 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4));
  }
  (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj.ChTime = T;
  (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x13])
            (this,(ulong)full_update);
  return;
}

Assistant:

void ChMatterSPH::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                                  const ChState& x,          // state vector, position part
                                  const unsigned int off_v,  // offset in v state vector
                                  const ChStateDelta& v,     // state vector, speed part
                                  const double T,            // time
                                  bool full_update           // perform complete update
) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->pos = x.segment(off_x + 3 * j, 3);
        nodes[j]->pos_dt = v.segment(off_v + 3 * j, 3);
    }
    SetChTime(T);
    Update(T, full_update);
}